

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboColorClearCase::render(FboColorClearCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  TextureChannelClass TVar1;
  int iVar2;
  int iVar3;
  int y;
  int width;
  int height;
  bool bVar4;
  Vec4 color;
  TextureFormat fboFormat;
  deUint32 rbo;
  deUint32 fbo;
  Random rnd;
  TextureFormatInfo fmtInfo;
  
  fboFormat = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  TVar1 = tcu::getTextureChannelClass(fboFormat.type);
  tcu::getTextureFormatInfo(&fmtInfo,&fboFormat);
  deRandom_init(&rnd.m_rnd,0x11);
  fbo = 0;
  rbo = 0;
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&rbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,rbo);
  sglr::ContextWrapper::glRenderbufferStorage
            (this_00,0x8d41,(this->super_FboColorbufferCase).m_format,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,this->m_height);
  FboTestCase::checkError((FboTestCase *)this);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,rbo);
  FboTestCase::checkError((FboTestCase *)this);
  FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  sglr::ContextWrapper::glViewport
            (this_00,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,this->m_height);
  switch((ulong)TVar1) {
  case 0:
  case 1:
  case 4:
    tcu::Vector<float,_4>::Vector(&color,0.0);
    sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,color.m_data);
    break;
  case 2:
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&color,0);
    sglr::ContextWrapper::glClearBufferiv(this_00,0x1800,0,(int *)&color);
    break;
  case 3:
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&color,0);
    sglr::ContextWrapper::glClearBufferuiv(this_00,0x1800,0,(deUint32 *)&color);
  }
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  iVar2 = 0x10;
  do {
    iVar3 = *(int *)&(this->super_FboColorbufferCase).field_0x8c;
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar4) {
      FboTestCase::readPixels
                ((FboTestCase *)this,dst,0,0,iVar3,this->m_height,&fboFormat,&fmtInfo.lookupScale,
                 &fmtInfo.lookupBias);
      FboTestCase::checkError((FboTestCase *)this);
      return;
    }
    iVar3 = de::Random::getInt(&rnd,0,iVar3 + -1);
    y = de::Random::getInt(&rnd,0,this->m_height + -1);
    width = de::Random::getInt(&rnd,1,*(int *)&(this->super_FboColorbufferCase).field_0x8c - iVar3);
    height = de::Random::getInt(&rnd,1,this->m_height - y);
    randomVector<4>((Functional *)&color,&rnd,&fmtInfo.valueMin,&fmtInfo.valueMax);
    sglr::ContextWrapper::glScissor(this_00,iVar3,y,width,height);
  } while (TEXTURECHANNELCLASS_FLOATING_POINT < TVar1);
  (*(code *)(&DAT_009efefc + *(int *)(&DAT_009efefc + (ulong)TVar1 * 4)))();
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat			fboFormat	= glu::mapGLInternalFormat(m_format);
		tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(fboFormat.type);
		tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(fboFormat);
		de::Random					rnd			(17);
		const int					numClears	= 16;
		deUint32					fbo			= 0;
		deUint32					rbo			= 0;

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);

		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_width, m_height);
		checkError();

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Initialize to transparent black.
		switch (fmtClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				glClearBufferfv(GL_COLOR, 0, Vec4(0.0f).getPtr());
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				glClearBufferuiv(GL_COLOR, 0, UVec4(0).getPtr());
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				glClearBufferiv(GL_COLOR, 0, IVec4(0).getPtr());
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		// Do random scissored clears.
		glEnable(GL_SCISSOR_TEST);
		for (int ndx = 0; ndx < numClears; ndx++)
		{
			int		x		= rnd.getInt(0, m_width		- 1);
			int		y		= rnd.getInt(0, m_height	- 1);
			int		w		= rnd.getInt(1, m_width		- x);
			int		h		= rnd.getInt(1, m_height	- y);
			Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glScissor(x, y, w, h);

			switch (fmtClass)
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
					glClearBufferfv(GL_COLOR, 0, color.getPtr());
					break;

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
					glClearBufferuiv(GL_COLOR, 0, color.cast<deUint32>().getPtr());
					break;

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
					glClearBufferiv(GL_COLOR, 0, color.cast<int>().getPtr());
					break;

				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Read results from renderbuffer.
		readPixels(dst, 0, 0, m_width, m_height, fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}